

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O3

bool tinyusdz::prim::ReconstructPrim<tinyusdz::SkelRoot>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,SkelRoot *root,
               string *warn,string *err,PrimReconstructOptions *options)

{
  _Base_ptr __k;
  size_type *psVar1;
  size_type *psVar2;
  size_type *psVar3;
  _Rb_tree_header *p_Var4;
  uint uVar5;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_> *pTVar6;
  bool bVar7;
  int iVar8;
  ostream *poVar9;
  long *plVar10;
  const_iterator cVar11;
  mapped_type *pmVar12;
  _Base_ptr p_Var13;
  Property *prop;
  char *pcVar14;
  bool bVar15;
  char *pcVar16;
  Attribute *attr;
  _Base_ptr p_Var17;
  ParseResult ret;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  ostringstream ss_w;
  undefined1 local_2d8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_2c0;
  string *local_2b0;
  string *local_2a8;
  string local_2a0;
  _Base_ptr local_280;
  TypedAttributeWithFallback<tinyusdz::Purpose> *local_278;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_> *local_270;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_268;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  *local_238;
  TypedAttribute<tinyusdz::Animatable<tinyusdz::Extent>_> *local_230;
  long *local_228 [2];
  long local_218 [2];
  string local_208;
  _Any_data local_1e8;
  code *local_1d8;
  code *pcStack_1d0;
  _Any_data local_1c8;
  code *local_1b8;
  code *pcStack_1b0;
  undefined1 local_1a8 [16];
  code *local_198;
  code *pcStack_190;
  ios_base local_138 [264];
  
  local_268._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_268._M_impl.super__Rb_tree_header._M_header;
  local_268._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bVar15 = false;
  local_268._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_268._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2b0 = warn;
  local_2a8 = err;
  local_268._M_impl.super__Rb_tree_header._M_header._M_right =
       local_268._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar7 = ReconstructXformOpsFromProperties
                    (spec,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_268,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                      *)properties,
                     (vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_> *)root,err);
  if (bVar7) {
    p_Var13 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var17 = &(properties->_M_t)._M_impl.super__Rb_tree_header._M_header;
    bVar15 = true;
    if (p_Var13 != p_Var17) {
      local_230 = &root->extent;
      local_238 = &root->props;
      local_278 = &root->purpose;
      local_270 = &root->visibility;
      local_280 = p_Var17;
      do {
        __k = p_Var13 + 1;
        iVar8 = ::std::__cxx11::string::compare((char *)__k);
        if (iVar8 == 0) {
          local_1a8._0_8_ = &local_198;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"visibility","");
          cVar11 = ::std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find(&local_268,(string *)local_1a8);
          if ((code **)local_1a8._0_8_ != &local_198) {
            operator_delete((void *)local_1a8._0_8_,(ulong)((long)local_198 + 1));
          }
          if ((_Rb_tree_header *)cVar11._M_node != &local_268._M_impl.super__Rb_tree_header)
          goto LAB_001f762c;
          if (((ulong)p_Var13[0x17]._M_parent & 0xfffffffe00000000) != 0x200000000) {
            Attribute::type_name_abi_cxx11_((string *)local_1a8,(Attribute *)(p_Var13 + 2));
            local_2d8._0_8_ = local_2d8 + 0x10;
            local_2d8._8_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x5;
            local_2d8._16_6_ = 0x6e656b6f74;
            if (((local_1a8._8_8_ == 5) &&
                ((char)*(int *)(local_1a8._0_8_ + 4) == 'n' && *(int *)local_1a8._0_8_ == 0x656b6f74
                )) && (uVar5 = *(uint *)((long)&p_Var13[0x17]._M_parent + 4), uVar5 < 2)) {
              if ((code **)local_1a8._0_8_ != &local_198) {
                operator_delete((void *)local_1a8._0_8_,(ulong)((long)local_198 + 1));
              }
              pTVar6 = local_270;
              if (uVar5 == 0) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"[warn]",6);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                           ,0x5a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"ReconstructPrim",0xf);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
                poVar9 = (ostream *)::std::ostream::operator<<((string *)local_1a8,0xb37);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"No value assigned to `",0x16);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"visibility",10);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"` token attribute. Set default token value.",0x2b);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
                p_Var17 = local_280;
                if (local_2b0 != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  plVar10 = (long *)::std::__cxx11::string::_M_append
                                              ((char *)&local_2a0,
                                               (ulong)(local_2a8->_M_dataplus)._M_p);
                  psVar2 = (size_type *)(plVar10 + 2);
                  if ((size_type *)*plVar10 == psVar2) {
                    local_2d8._16_8_ = *psVar2;
                    aStack_2c0._M_allocated_capacity = plVar10[3];
                    local_2d8._0_8_ = local_2d8 + 0x10;
                  }
                  else {
                    local_2d8._16_8_ = *psVar2;
                    local_2d8._0_8_ = (size_type *)*plVar10;
                  }
                  local_2d8._8_8_ = plVar10[1];
                  *plVar10 = (long)psVar2;
                  plVar10[1] = 0;
                  *(undefined1 *)(plVar10 + 2) = 0;
                  ::std::__cxx11::string::operator=((string *)local_2b0,(string *)local_2d8);
                  if ((undefined1 *)local_2d8._0_8_ != local_2d8 + 0x10) {
                    operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
                    operator_delete(local_2a0._M_dataplus._M_p,
                                    local_2a0.field_2._M_allocated_capacity + 1);
                  }
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
                ::std::ios_base::~ios_base(local_138);
                AttrMetas::operator=(&pTVar6->_metas,(AttrMetas *)(p_Var13 + 7));
                pcVar16 = "visibility";
                pcVar14 = "";
LAB_001f77aa:
                local_1a8._0_8_ = &local_198;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_1a8,pcVar16,pcVar14);
                ::std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)&local_268,(string *)local_1a8);
                if ((code **)local_1a8._0_8_ != &local_198) {
                  operator_delete((void *)local_1a8._0_8_,(ulong)((long)local_198 + 1));
                }
                goto LAB_001f762c;
              }
            }
            else if ((code **)local_1a8._0_8_ != &local_198) {
              operator_delete((void *)local_1a8._0_8_,(ulong)((long)local_198 + 1));
            }
          }
          pTVar6 = local_270;
          local_1a8._8_8_ = 0;
          local_1a8._0_8_ = VisibilityEnumHandler;
          pcStack_190 = ::std::
                        _Function_handler<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        ::_M_invoke;
          local_198 = ::std::
                      _Function_handler<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      ::_M_manager;
          local_2d8._0_8_ = local_2d8 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"visibility","");
          bVar7 = options->strict_allowedToken_check;
          local_1b8 = (code *)0x0;
          pcStack_1b0 = (code *)0x0;
          local_1c8._M_unused._M_object = (void *)0x0;
          local_1c8._8_8_ = 0;
          if (local_198 != (code *)0x0) {
            (*local_198)(&local_1c8,(string *)local_1a8,2);
            local_1b8 = local_198;
            pcStack_1b0 = pcStack_190;
          }
          bVar7 = ParseTimeSampledEnumProperty<tinyusdz::Visibility,tinyusdz::Visibility>
                            ((string *)local_2d8,bVar7,
                             (EnumHandlerFun<tinyusdz::Visibility> *)&local_1c8,
                             (Attribute *)(p_Var13 + 2),pTVar6,local_2b0,local_2a8);
          if (local_1b8 != (code *)0x0) {
            (*local_1b8)(&local_1c8,&local_1c8,__destroy_functor);
          }
          if ((undefined1 *)local_2d8._0_8_ != local_2d8 + 0x10) {
            operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ + 1);
          }
          iVar8 = 1;
          if (bVar7) {
            AttrMetas::operator=(&pTVar6->_metas,(AttrMetas *)(p_Var13 + 7));
            local_2d8._0_8_ = local_2d8 + 0x10;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"visibility","");
            ::std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&local_268,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2d8);
            if ((undefined1 *)local_2d8._0_8_ != local_2d8 + 0x10) {
LAB_001f7081:
              operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ + 1);
            }
LAB_001f708e:
            iVar8 = 3;
          }
LAB_001f7216:
          if (local_198 != (code *)0x0) {
            (*local_198)((string *)local_1a8,(string *)local_1a8,3);
          }
LAB_001f7592:
          p_Var17 = local_280;
          if ((iVar8 != 3) && (iVar8 != 0)) {
            bVar15 = false;
            goto LAB_001f77e7;
          }
        }
        else {
          iVar8 = ::std::__cxx11::string::compare((char *)__k);
          if (iVar8 == 0) {
            local_1a8._0_8_ = &local_198;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"purpose","");
            cVar11 = ::std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::find(&local_268,(string *)local_1a8);
            if ((code **)local_1a8._0_8_ != &local_198) {
              operator_delete((void *)local_1a8._0_8_,(ulong)((long)local_198 + 1));
            }
            if ((_Rb_tree_header *)cVar11._M_node == &local_268._M_impl.super__Rb_tree_header) {
              psVar2 = (size_type *)(local_2d8 + 0x10);
              if (((ulong)p_Var13[0x17]._M_parent & 0xfffffffe00000000) != 0x200000000) {
                Attribute::type_name_abi_cxx11_((string *)local_1a8,(Attribute *)(p_Var13 + 2));
                local_2d8._8_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x5;
                local_2d8._16_6_ = 0x6e656b6f74;
                if (((local_1a8._8_8_ == 5) &&
                    ((char)*(int *)(local_1a8._0_8_ + 4) == 'n' &&
                     *(int *)local_1a8._0_8_ == 0x656b6f74)) &&
                   (uVar5 = *(uint *)((long)&p_Var13[0x17]._M_parent + 4), uVar5 < 2)) {
                  local_2d8._0_8_ = psVar2;
                  if ((code **)local_1a8._0_8_ != &local_198) {
                    operator_delete((void *)local_1a8._0_8_,(ulong)((long)local_198 + 1));
                  }
                  if (uVar5 == 0) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,"[warn]",6);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                               ,0x5a);
                    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1)
                    ;
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,"ReconstructPrim",0xf);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,"():",3);
                    poVar9 = (ostream *)::std::ostream::operator<<((string *)local_1a8,0xb39);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,"No value assigned to `",0x16);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,"purpose",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,"` token attribute. Set default token value.",
                               0x2b);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,"\n",1);
                    p_Var17 = local_280;
                    if (local_2b0 != (string *)0x0) {
                      ::std::__cxx11::stringbuf::str();
                      plVar10 = (long *)::std::__cxx11::string::_M_append
                                                  ((char *)&local_2a0,
                                                   (ulong)(local_2a8->_M_dataplus)._M_p);
                      psVar3 = (size_type *)(plVar10 + 2);
                      if ((size_type *)*plVar10 == psVar3) {
                        local_2d8._16_8_ = *psVar3;
                        aStack_2c0._M_allocated_capacity = plVar10[3];
                        local_2d8._0_8_ = psVar2;
                      }
                      else {
                        local_2d8._16_8_ = *psVar3;
                        local_2d8._0_8_ = (size_type *)*plVar10;
                      }
                      local_2d8._8_8_ = plVar10[1];
                      *plVar10 = (long)psVar3;
                      plVar10[1] = 0;
                      *(undefined1 *)(plVar10 + 2) = 0;
                      ::std::__cxx11::string::operator=((string *)local_2b0,(string *)local_2d8);
                      if ((size_type *)local_2d8._0_8_ != psVar2) {
                        operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
                        operator_delete(local_2a0._M_dataplus._M_p,
                                        local_2a0.field_2._M_allocated_capacity + 1);
                      }
                    }
                    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
                    ::std::ios_base::~ios_base(local_138);
                    AttrMetas::operator=(&local_278->_metas,(AttrMetas *)(p_Var13 + 7));
                    pcVar16 = "purpose";
                    pcVar14 = "";
                    goto LAB_001f77aa;
                  }
                }
                else if ((code **)local_1a8._0_8_ != &local_198) {
                  local_2d8._0_8_ = psVar2;
                  operator_delete((void *)local_1a8._0_8_,(ulong)((long)local_198 + 1));
                }
              }
              local_1a8._8_8_ = 0;
              local_1a8._0_8_ = PurposeEnumHandler;
              pcStack_190 = ::std::
                            _Function_handler<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                            ::_M_invoke;
              local_198 = ::std::
                          _Function_handler<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                          ::_M_manager;
              local_2d8._0_8_ = psVar2;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"purpose","");
              bVar7 = options->strict_allowedToken_check;
              local_1d8 = (code *)0x0;
              pcStack_1d0 = (code *)0x0;
              local_1e8._M_unused._M_object = (void *)0x0;
              local_1e8._8_8_ = 0;
              if (local_198 != (code *)0x0) {
                (*local_198)(&local_1e8,(string *)local_1a8,2);
                local_1d8 = local_198;
                pcStack_1d0 = pcStack_190;
              }
              bVar7 = ParseUniformEnumProperty<tinyusdz::Purpose,tinyusdz::Purpose>
                                ((string *)local_2d8,bVar7,
                                 (EnumHandlerFun<tinyusdz::Purpose> *)&local_1e8,
                                 (Attribute *)(p_Var13 + 2),local_278,local_2b0,local_2a8);
              if (local_1d8 != (code *)0x0) {
                (*local_1d8)(&local_1e8,&local_1e8,__destroy_functor);
              }
              if ((size_type *)local_2d8._0_8_ != psVar2) {
                operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ + 1);
              }
              iVar8 = 1;
              if (bVar7) {
                AttrMetas::operator=(&local_278->_metas,(AttrMetas *)(p_Var13 + 7));
                local_2d8._0_8_ = psVar2;
                ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"purpose","");
                ::std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)&local_268,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_2d8);
                if ((size_type *)local_2d8._0_8_ != psVar2) goto LAB_001f7081;
                goto LAB_001f708e;
              }
              goto LAB_001f7216;
            }
          }
          else {
            local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_208,*(long *)(p_Var13 + 1),
                       (long)&(p_Var13[1]._M_parent)->_M_color + *(long *)(p_Var13 + 1));
            prop = (Property *)(p_Var13 + 2);
            local_1a8._0_8_ = &local_198;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"extent","");
            anon_unknown_0::ParseExtentAttribute
                      ((ParseResult *)local_2d8,
                       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_268,&local_208,prop,(string *)local_1a8,local_230);
            if ((code **)local_1a8._0_8_ != &local_198) {
              operator_delete((void *)local_1a8._0_8_,(ulong)((long)local_198 + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_208._M_dataplus._M_p != &local_208.field_2) {
              operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1
                             );
            }
            iVar8 = 0;
            if ((local_2d8._0_8_ & 0xfffffffd) == 0) {
              iVar8 = 3;
LAB_001f72be:
              bVar7 = false;
            }
            else {
              bVar7 = true;
              if (local_2d8._0_4_ != Unmatched) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                           ,0x5a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"ReconstructPrim",0xf);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
                poVar9 = (ostream *)::std::ostream::operator<<((string *)local_1a8,0xb3a);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
                local_228[0] = local_218;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_228,"Parsing attribute `extent` failed. Error: {}","");
                fmt::format<std::__cxx11::string>
                          (&local_2a0,(fmt *)local_228,(string *)(local_2d8 + 8),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)prop
                          );
                poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)local_1a8,local_2a0._M_dataplus._M_p,
                                    local_2a0._M_string_length);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
                  operator_delete(local_2a0._M_dataplus._M_p,
                                  local_2a0.field_2._M_allocated_capacity + 1);
                }
                if (local_228[0] != local_218) {
                  operator_delete(local_228[0],local_218[0] + 1);
                }
                if (local_2a8 != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  plVar10 = (long *)::std::__cxx11::string::_M_append
                                              ((char *)local_228,
                                               (ulong)(local_2a8->_M_dataplus)._M_p);
                  psVar1 = (size_type *)(plVar10 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar10 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar1) {
                    local_2a0.field_2._M_allocated_capacity = *psVar1;
                    local_2a0.field_2._8_8_ = plVar10[3];
                    local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
                  }
                  else {
                    local_2a0.field_2._M_allocated_capacity = *psVar1;
                    local_2a0._M_dataplus._M_p = (pointer)*plVar10;
                  }
                  local_2a0._M_string_length = plVar10[1];
                  *plVar10 = (long)psVar1;
                  plVar10[1] = 0;
                  *(undefined1 *)(plVar10 + 2) = 0;
                  ::std::__cxx11::string::operator=((string *)local_2a8,(string *)&local_2a0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
                    operator_delete(local_2a0._M_dataplus._M_p,
                                    local_2a0.field_2._M_allocated_capacity + 1);
                  }
                  if (local_228[0] != local_218) {
                    operator_delete(local_228[0],local_218[0] + 1);
                  }
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
                ::std::ios_base::~ios_base(local_138);
                iVar8 = 1;
                goto LAB_001f72be;
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2d8._8_8_ != &aStack_2c0) {
              operator_delete((void *)local_2d8._8_8_,aStack_2c0._M_allocated_capacity + 1);
            }
            if (!bVar7) goto LAB_001f7592;
            cVar11 = ::std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::find(&local_268,(key_type *)__k);
            p_Var4 = &local_268._M_impl.super__Rb_tree_header;
            if ((_Rb_tree_header *)cVar11._M_node == p_Var4) {
              pmVar12 = ::std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                        ::operator[](local_238,(key_type *)__k);
              ::std::__cxx11::string::_M_assign((string *)pmVar12);
              (pmVar12->_attrib)._varying_authored = (bool)p_Var13[3].field_0x4;
              (pmVar12->_attrib)._variability = p_Var13[3]._M_color;
              ::std::__cxx11::string::_M_assign((string *)&(pmVar12->_attrib)._type_name);
              linb::any::operator=((any *)&(pmVar12->_attrib)._var,(any *)&p_Var13[4]._M_parent);
              (pmVar12->_attrib)._var._blocked = SUB41(p_Var13[5]._M_color,0);
              ::std::
              vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
              ::operator=((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                           *)&(pmVar12->_attrib)._var._ts,
                          (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                           *)&p_Var13[5]._M_parent);
              (pmVar12->_attrib)._var._ts._dirty = SUB41(p_Var13[6]._M_color,0);
              std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                        (&(pmVar12->_attrib)._paths,
                         (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                         &p_Var13[6]._M_parent);
              AttrMetas::operator=(&(pmVar12->_attrib)._metas,(AttrMetas *)(p_Var13 + 7));
              *(_Base_ptr *)&pmVar12->_listOpQual = p_Var13[0x17]._M_parent;
              (pmVar12->_rel).type = *(Type *)&p_Var13[0x17]._M_left;
              Path::operator=(&(pmVar12->_rel).targetPath,(Path *)&p_Var13[0x17]._M_right);
              std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                        (&(pmVar12->_rel).targetPathVector,
                         (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                         &p_Var13[0x1e]._M_parent);
              (pmVar12->_rel).listOpQual = p_Var13[0x1f]._M_color;
              AttrMetas::operator=(&(pmVar12->_rel)._metas,(AttrMetas *)&p_Var13[0x1f]._M_parent);
              (pmVar12->_rel)._varying_authored = *(bool *)&p_Var13[0x2f]._M_left;
              ::std::__cxx11::string::_M_assign((string *)&pmVar12->_prop_value_type_name);
              pmVar12->_has_custom = *(bool *)&p_Var13[0x30]._M_right;
              ::std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&local_268,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k);
            }
            cVar11 = ::std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::find(&local_268,(key_type *)__k);
            p_Var17 = local_280;
            if ((_Rb_tree_header *)cVar11._M_node == p_Var4) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[warn]",6);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"ReconstructPrim",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
              poVar9 = (ostream *)::std::ostream::operator<<((string *)local_1a8,0xb3c);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_2d8,"Unsupported/unimplemented property: ",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               __k);
              poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_1a8,(char *)local_2d8._0_8_,local_2d8._8_8_);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
              psVar2 = (size_type *)(local_2d8 + 0x10);
              if ((size_type *)local_2d8._0_8_ != psVar2) {
                operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ + 1);
              }
              if (local_2b0 != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                plVar10 = (long *)::std::__cxx11::string::_M_append
                                            ((char *)&local_2a0,(ulong)(local_2a8->_M_dataplus)._M_p
                                            );
                psVar3 = (size_type *)(plVar10 + 2);
                if ((size_type *)*plVar10 == psVar3) {
                  local_2d8._16_8_ = *psVar3;
                  aStack_2c0._M_allocated_capacity = plVar10[3];
                  local_2d8._0_8_ = psVar2;
                }
                else {
                  local_2d8._16_8_ = *psVar3;
                  local_2d8._0_8_ = (size_type *)*plVar10;
                }
                local_2d8._8_8_ = plVar10[1];
                *plVar10 = (long)psVar3;
                plVar10[1] = 0;
                *(undefined1 *)(plVar10 + 2) = 0;
                ::std::__cxx11::string::operator=((string *)local_2b0,(string *)local_2d8);
                if ((size_type *)local_2d8._0_8_ != psVar2) {
                  operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
                  operator_delete(local_2a0._M_dataplus._M_p,
                                  local_2a0.field_2._M_allocated_capacity + 1);
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
              ::std::ios_base::~ios_base(local_138);
            }
          }
        }
LAB_001f762c:
        p_Var13 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var13);
      } while (p_Var13 != p_Var17);
      bVar15 = true;
    }
  }
LAB_001f77e7:
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(&local_268,(_Link_type)local_268._M_impl.super__Rb_tree_header._M_header._M_parent);
  return bVar15;
}

Assistant:

bool ReconstructPrim<SkelRoot>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    SkelRoot *root,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options) {

  (void)references;
  (void)options;

  std::set<std::string> table;
  if (!prim::ReconstructXformOpsFromProperties(spec, table, properties, &root->xformOps, err)) {
    return false;
  }

  // SkelRoot is something like a grouping node, having 1 Skeleton and possibly?
  // multiple Prim hierarchy containing GeomMesh.
  // No specific properties for SkelRoot(AFAIK)

  // custom props only
  for (const auto &prop : properties) {
    PARSE_TIMESAMPLED_ENUM_PROPERTY(table, prop, kVisibility, Visibility, VisibilityEnumHandler, SkelRoot,
                   root->visibility, options.strict_allowedToken_check)
    PARSE_UNIFORM_ENUM_PROPERTY(table, prop, kPurpose, Purpose, PurposeEnumHandler, SkelRoot,
                       root->purpose, options.strict_allowedToken_check)
    PARSE_EXTENT_ATTRIBUTE(table, prop, kExtent, SkelRoot, root->extent)
    ADD_PROPERTY(table, prop, SkelRoot, root->props)
    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }

  return true;
}